

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxread.c
# Opt level: O0

int MuxImageParse(WebPChunk *chunk,int copy_data,WebPMuxImage *wpi)

{
  ulong uVar1;
  WebPMuxError WVar2;
  WebPChunkId WVar3;
  int iVar4;
  size_t data_size;
  size_t sVar5;
  uint8_t *data;
  long in_RDX;
  long in_RDI;
  WebPData temp;
  size_t hdr_size;
  WebPChunk **unknown_chunk_list;
  size_t subchunk_size;
  WebPChunk subchunk;
  uint8_t *last;
  size_t size;
  uint8_t *bytes;
  uint32_t in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  WebPChunk *pWVar6;
  WebPChunk *chunk_00;
  WebPChunk *chunk_01;
  undefined8 uVar7;
  WebPMuxImage *wpi_00;
  uint32_t in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  WebPChunk *local_28;
  
  local_28 = *(WebPChunk **)(in_RDI + 8);
  uVar1 = *(ulong *)(in_RDI + 0x10);
  if (local_28 == (WebPChunk *)0x0) {
    pWVar6 = (WebPChunk *)0x0;
  }
  else {
    pWVar6 = (WebPChunk *)((long)&local_28->tag + uVar1);
  }
  data_size = in_RDX + 0x18;
  chunk_00 = pWVar6;
  ChunkInit((WebPChunk *)0x1a6e5f);
  wpi_00 = (WebPMuxImage *)&working_state_cur_put_buffer_simd;
  uVar7 = 0;
  if (((0xf < uVar1) &&
      (chunk_01 = local_28,
      WVar2 = ChunkAssignData(chunk_00,(WebPData *)
                                       CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70)
                              ,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
      WVar2 == WEBP_MUX_OK)) &&
     (WVar2 = ChunkSetHead(chunk_00,(WebPChunk **)
                                    CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70)),
     WVar2 == WEBP_MUX_OK)) {
    *(undefined4 *)(in_RDX + 0x2c) = 1;
    sVar5 = ChunkDiskSize((WebPChunk *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70)
                         );
    data = (uint8_t *)(sVar5 - 8);
    for (local_28 = (WebPChunk *)(data + (long)local_28); local_28 != pWVar6;
        local_28 = (WebPChunk *)(data + (long)local_28)) {
      ChunkInit((WebPChunk *)0x1a6f25);
      WVar2 = ChunkVerifyAndAssign
                        ((WebPChunk *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                         data,data_size,(size_t)wpi_00,(int)((ulong)uVar7 >> 0x20));
      if (WVar2 != WEBP_MUX_OK) goto LAB_001a7085;
      WVar3 = ChunkGetIdFromTag(in_stack_ffffffffffffffa8);
      if (WVar3 == WEBP_CHUNK_ALPHA) {
        if ((*(long *)(in_RDX + 8) != 0) ||
           (WVar2 = ChunkSetHead(chunk_00,(WebPChunk **)CONCAT44(5,in_stack_ffffffffffffff70)),
           WVar2 != WEBP_MUX_OK)) goto LAB_001a7085;
        *(undefined4 *)(in_RDX + 0x2c) = 1;
      }
      else if (WVar3 == WEBP_CHUNK_IMAGE) {
        if (((*(long *)(in_RDX + 0x10) != 0) ||
            (WVar2 = ChunkSetHead(chunk_00,(WebPChunk **)CONCAT44(6,in_stack_ffffffffffffff70)),
            WVar2 != WEBP_MUX_OK)) || (iVar4 = MuxImageFinalize(wpi_00), iVar4 == 0))
        goto LAB_001a7085;
        *(undefined4 *)(in_RDX + 0x2c) = 0;
      }
      else if (((WVar3 != WEBP_CHUNK_UNKNOWN) || (*(int *)(in_RDX + 0x2c) != 0)) ||
              (WVar2 = ChunkAppend(chunk_01,(WebPChunk ***)chunk_00), WVar2 != WEBP_MUX_OK))
      goto LAB_001a7085;
      data = (uint8_t *)ChunkDiskSize((WebPChunk *)CONCAT44(WVar3,in_stack_ffffffffffffff70));
    }
    if (*(int *)(in_RDX + 0x2c) == 0) {
      return 1;
    }
  }
LAB_001a7085:
  ChunkRelease((WebPChunk *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  return 0;
}

Assistant:

static int MuxImageParse(const WebPChunk* const chunk, int copy_data,
                         WebPMuxImage* const wpi) {
  const uint8_t* bytes = chunk->data.bytes;
  size_t size = chunk->data.size;
  const uint8_t* const last = (bytes == NULL) ? NULL : bytes + size;
  WebPChunk subchunk;
  size_t subchunk_size;
  WebPChunk** unknown_chunk_list = &wpi->unknown;
  ChunkInit(&subchunk);

  assert(chunk->tag == kChunks[IDX_ANMF].tag);
  assert(!wpi->is_partial);

  // ANMF.
  {
    const size_t hdr_size = ANMF_CHUNK_SIZE;
    const WebPData temp = { bytes, hdr_size };
    // Each of ANMF chunk contain a header at the beginning. So, its size should
    // be at least 'hdr_size'.
    if (size < hdr_size) goto Fail;
    if (ChunkAssignData(&subchunk, &temp, copy_data,
                        chunk->tag) != WEBP_MUX_OK) {
      goto Fail;
    }
  }
  if (ChunkSetHead(&subchunk, &wpi->header) != WEBP_MUX_OK) goto Fail;
  wpi->is_partial = 1;  // Waiting for ALPH and/or VP8/VP8L chunks.

  // Rest of the chunks.
  subchunk_size = ChunkDiskSize(&subchunk) - CHUNK_HEADER_SIZE;
  bytes += subchunk_size;
  size -= subchunk_size;

  while (bytes != last) {
    ChunkInit(&subchunk);
    if (ChunkVerifyAndAssign(&subchunk, bytes, size, size,
                             copy_data) != WEBP_MUX_OK) {
      goto Fail;
    }
    switch (ChunkGetIdFromTag(subchunk.tag)) {
      case WEBP_CHUNK_ALPHA:
        if (wpi->alpha != NULL) goto Fail;  // Consecutive ALPH chunks.
        if (ChunkSetHead(&subchunk, &wpi->alpha) != WEBP_MUX_OK) goto Fail;
        wpi->is_partial = 1;  // Waiting for a VP8 chunk.
        break;
      case WEBP_CHUNK_IMAGE:
        if (wpi->img != NULL) goto Fail;  // Only 1 image chunk allowed.
        if (ChunkSetHead(&subchunk, &wpi->img) != WEBP_MUX_OK) goto Fail;
        if (!MuxImageFinalize(wpi)) goto Fail;
        wpi->is_partial = 0;  // wpi is completely filled.
        break;
      case WEBP_CHUNK_UNKNOWN:
        if (wpi->is_partial) {
          goto Fail;  // Encountered an unknown chunk
                      // before some image chunks.
        }
        if (ChunkAppend(&subchunk, &unknown_chunk_list) != WEBP_MUX_OK) {
          goto Fail;
        }
        break;
      default:
        goto Fail;
    }
    subchunk_size = ChunkDiskSize(&subchunk);
    bytes += subchunk_size;
    size -= subchunk_size;
  }
  if (wpi->is_partial) goto Fail;
  return 1;

 Fail:
  ChunkRelease(&subchunk);
  return 0;
}